

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

FilteredBreakIteratorBuilder *
icu_63::FilteredBreakIteratorBuilder::createInstance(Locale *where,UErrorCode *status)

{
  UBool UVar1;
  SimpleFilteredBreakIteratorBuilder *this;
  Locale *local_70;
  SimpleFilteredBreakIteratorBuilder *local_50;
  LocalPointerBase<icu_63::FilteredBreakIteratorBuilder> local_28;
  LocalPointer<icu_63::FilteredBreakIteratorBuilder> ret;
  UErrorCode *status_local;
  Locale *where_local;
  
  ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr =
       (LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>)
       (LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (SimpleFilteredBreakIteratorBuilder *)
           UMemory::operator_new((UMemory *)0x30,(size_t)status);
    local_50 = (SimpleFilteredBreakIteratorBuilder *)0x0;
    if (this != (SimpleFilteredBreakIteratorBuilder *)0x0) {
      SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder
                (this,where,
                 (UErrorCode *)ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr)
      ;
      local_50 = this;
    }
    LocalPointer<icu_63::FilteredBreakIteratorBuilder>::LocalPointer
              ((LocalPointer<icu_63::FilteredBreakIteratorBuilder> *)&local_28,
               &local_50->super_FilteredBreakIteratorBuilder,
               (UErrorCode *)ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr);
    UVar1 = ::U_SUCCESS(*(UErrorCode *)
                         ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr);
    if (UVar1 == '\0') {
      local_70 = (Locale *)0x0;
    }
    else {
      local_70 = (Locale *)LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>::orphan(&local_28)
      ;
    }
    where_local = local_70;
    LocalPointer<icu_63::FilteredBreakIteratorBuilder>::~LocalPointer
              ((LocalPointer<icu_63::FilteredBreakIteratorBuilder> *)&local_28);
  }
  else {
    where_local = (Locale *)0x0;
  }
  return (FilteredBreakIteratorBuilder *)where_local;
}

Assistant:

FilteredBreakIteratorBuilder *
FilteredBreakIteratorBuilder::createInstance(const Locale& where, UErrorCode& status) {
  if(U_FAILURE(status)) return NULL;
  LocalPointer<FilteredBreakIteratorBuilder> ret(new SimpleFilteredBreakIteratorBuilder(where, status), status);
  return (U_SUCCESS(status))? ret.orphan(): NULL;
}